

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
      *this)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>::val
                    (&this->left_->fadexpr_);
  vVar2 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
          ::val(&this->right_->fadexpr_);
  return vVar2 * vVar1;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}